

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVProcessChain.cxx
# Opt level: O1

bool __thiscall
cmUVProcessChain::InternalData::Prepare(InternalData *this,cmUVProcessChainBuilder *builder)

{
  StdioType SVar1;
  cmUVProcessChainBuilder *pcVar2;
  ProcessData *pPVar3;
  __uniq_ptr_data<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>,_true,_true>
  _Var4;
  int iVar5;
  uv_loop_t *puVar6;
  uv_pipe_s *puVar7;
  long lVar8;
  ulong uVar9;
  uv_pipe_ptr *this_00;
  undefined8 unaff_R15;
  ulong uVar10;
  bool bVar11;
  bool bVar12;
  int pipeFd [2];
  undefined8 local_40;
  uint local_34;
  
  this->Builder = builder;
  puVar6 = builder->Loop;
  if (puVar6 == (uv_loop_t *)0x0) {
    ::cm::uv_loop_ptr::init(&this->BuiltinLoop,(EVP_PKEY_CTX *)0x0);
    puVar6 = ::cm::uv_loop_ptr::operator_cast_to_uv_loop_s_(&this->BuiltinLoop);
  }
  this->Loop = puVar6;
  pcVar2 = this->Builder;
  SVar1 = (pcVar2->Stdio)._M_elems[0].Type;
  if (SVar1 == None) {
    lVar8 = 0x30;
    iVar5 = 0;
LAB_003eb0fb:
    *(int *)((long)&this->Builder + lVar8) = iVar5;
  }
  else if (SVar1 == External) {
    (this->InputStreamData).Stdio.flags = UV_INHERIT_FD;
    iVar5 = (pcVar2->Stdio)._M_elems[0].FileDescriptor;
    lVar8 = 0x38;
    goto LAB_003eb0fb;
  }
  SVar1 = (pcVar2->Stdio)._M_elems[2].Type;
  if (SVar1 == None) {
    lVar8 = 0x60;
    iVar5 = 0;
LAB_003eb187:
    *(int *)((long)&this->Builder + lVar8) = iVar5;
  }
  else {
    if (SVar1 == External) {
      (this->ErrorStreamData).Stdio.flags = UV_INHERIT_FD;
      iVar5 = (pcVar2->Stdio)._M_elems[2].FileDescriptor;
      lVar8 = 0x68;
      goto LAB_003eb187;
    }
    if (SVar1 == Builtin) {
      iVar5 = cmGetPipes((int *)&local_40);
      if (iVar5 < 0) {
        return false;
      }
      (this->ErrorStreamData).BuiltinStream = (int)local_40;
      (this->ErrorStreamData).Stdio.flags = UV_INHERIT_FD;
      (this->ErrorStreamData).Stdio.data.fd = local_40._4_4_;
      iVar5 = ::cm::uv_pipe_ptr::init(&this->TempErrorPipe,(EVP_PKEY_CTX *)this->Loop);
      if (iVar5 < 0) {
        return false;
      }
      puVar7 = ::cm::uv_handle_ptr_::operator_cast_to_uv_pipe_s_
                         (&(this->TempErrorPipe).super_uv_handle_ptr_<uv_pipe_s>);
      iVar5 = uv_pipe_open(puVar7,(this->ErrorStreamData).Stdio.data.fd);
      if (iVar5 < 0) {
        return false;
      }
    }
  }
  pcVar2 = this->Builder;
  SVar1 = (pcVar2->Stdio)._M_elems[1].Type;
  if (SVar1 == None) {
    lVar8 = 0x48;
    iVar5 = 0;
  }
  else {
    if (SVar1 == External) {
      (this->OutputStreamData).Stdio.flags = UV_INHERIT_FD;
      iVar5 = (pcVar2->Stdio)._M_elems[1].FileDescriptor;
    }
    else {
      if (SVar1 != Builtin) goto LAB_003eb1d3;
      if (pcVar2->MergedBuiltinStreams != true) {
        iVar5 = cmGetPipes((int *)&local_40);
        if (-1 < iVar5) {
          (this->OutputStreamData).BuiltinStream = (int)local_40;
          (this->OutputStreamData).Stdio.flags = UV_INHERIT_FD;
          (this->OutputStreamData).Stdio.data.fd = local_40._4_4_;
          iVar5 = ::cm::uv_pipe_ptr::init(&this->TempOutputPipe,(EVP_PKEY_CTX *)this->Loop);
          if (-1 < iVar5) {
            puVar7 = ::cm::uv_handle_ptr_::operator_cast_to_uv_pipe_s_
                               (&(this->TempOutputPipe).super_uv_handle_ptr_<uv_pipe_s>);
            iVar5 = uv_pipe_open(puVar7,(this->OutputStreamData).Stdio.data.fd);
            if (-1 < iVar5) goto LAB_003eb1d3;
          }
        }
        return false;
      }
      iVar5 = (this->ErrorStreamData).Stdio.data.fd;
      (this->OutputStreamData).BuiltinStream = (this->ErrorStreamData).BuiltinStream;
      (this->OutputStreamData).Stdio.flags = UV_INHERIT_FD;
    }
    lVar8 = 0x50;
  }
  *(int *)((long)&this->Builder + lVar8) = iVar5;
LAB_003eb1d3:
  bVar12 = (this->Builder->Processes).
           super__Vector_base<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
           ._M_impl.super__Vector_impl_data._M_finish ==
           (this->Builder->Processes).
           super__Vector_base<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (!bVar12) {
    uVar10 = CONCAT71((int7)((ulong)unaff_R15 >> 8),1);
    uVar9 = 0;
    do {
      local_40 = (ProcessData *)operator_new(0x50);
      local_40->Data = (InternalData *)0x0;
      (local_40->Process).super_uv_handle_ptr_<uv_process_s>.super_uv_handle_ptr_base_<uv_process_s>
      .handle.super___shared_ptr<uv_process_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (local_40->Process).super_uv_handle_ptr_<uv_process_s>.super_uv_handle_ptr_base_<uv_process_s>
      .handle.super___shared_ptr<uv_process_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (local_40->InputPipe).super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.
      handle.super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      (local_40->InputPipe).super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.
      handle.super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (local_40->OutputPipe).super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.
      handle.super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      (local_40->OutputPipe).super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.
      handle.super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (local_40->ProcessStatus).SpawnResult = 0;
      (local_40->ProcessStatus).Finished = false;
      *(undefined3 *)&(local_40->ProcessStatus).field_0x5 = 0;
      (local_40->ProcessStatus).ExitStatus = 0;
      *(undefined8 *)&(local_40->ProcessStatus).TermSignal = 0;
      std::
      vector<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,std::default_delete<cmUVProcessChain::InternalData::ProcessData>>,std::allocator<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,std::default_delete<cmUVProcessChain::InternalData::ProcessData>>>>
      ::
      emplace_back<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,std::default_delete<cmUVProcessChain::InternalData::ProcessData>>>
                ((vector<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,std::default_delete<cmUVProcessChain::InternalData::ProcessData>>,std::allocator<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,std::default_delete<cmUVProcessChain::InternalData::ProcessData>>>>
                  *)&this->Processes,
                 (unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>
                  *)&local_40);
      if (local_40 != (ProcessData *)0x0) {
        std::default_delete<cmUVProcessChain::InternalData::ProcessData>::operator()
                  ((default_delete<cmUVProcessChain::InternalData::ProcessData> *)&local_40,local_40
                  );
      }
      pPVar3 = (this->Processes).
               super__Vector_base<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>,_std::allocator<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
               super___uniq_ptr_impl<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmUVProcessChain::InternalData::ProcessData_*,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>
               .super__Head_base<0UL,_cmUVProcessChain::InternalData::ProcessData_*,_false>.
               _M_head_impl;
      pPVar3->Data = this;
      (pPVar3->ProcessStatus).Finished = false;
      if ((uVar10 & 1) == 0) {
        local_34 = (uint)uVar10;
        _Var4.
        super___uniq_ptr_impl<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>
        ._M_t.
        super__Tuple_impl<0UL,_cmUVProcessChain::InternalData::ProcessData_*,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>
        .super__Head_base<0UL,_cmUVProcessChain::InternalData::ProcessData_*,_false>._M_head_impl =
             (this->Processes).
             super__Vector_base<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>,_std::allocator<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar9 - 1]._M_t.
             super___uniq_ptr_impl<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>
        ;
        iVar5 = cmGetPipes((int *)&local_40);
        if (-1 < iVar5) {
          this_00 = (uv_pipe_ptr *)
                    ((long)_Var4.
                           super___uniq_ptr_impl<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmUVProcessChain::InternalData::ProcessData_*,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>
                           .
                           super__Head_base<0UL,_cmUVProcessChain::InternalData::ProcessData_*,_false>
                           ._M_head_impl + 0x28);
          iVar5 = ::cm::uv_pipe_ptr::init(this_00,(EVP_PKEY_CTX *)this->Loop);
          if (-1 < iVar5) {
            puVar7 = ::cm::uv_handle_ptr_::operator_cast_to_uv_pipe_s_
                               ((uv_handle_ptr_<uv_pipe_s> *)this_00);
            iVar5 = uv_pipe_open(puVar7,local_40._4_4_);
            if (-1 < iVar5) {
              iVar5 = ::cm::uv_pipe_ptr::init(&pPVar3->InputPipe,(EVP_PKEY_CTX *)this->Loop);
              if (-1 < iVar5) {
                puVar7 = ::cm::uv_handle_ptr_::operator_cast_to_uv_pipe_s_
                                   (&(pPVar3->InputPipe).super_uv_handle_ptr_<uv_pipe_s>);
                iVar5 = uv_pipe_open(puVar7,(int)local_40);
                uVar10 = (ulong)local_34;
                if (-1 < iVar5) goto LAB_003eb255;
                bVar12 = false;
                goto LAB_003eb2fe;
              }
            }
          }
        }
        bVar12 = false;
        uVar10 = (ulong)local_34;
      }
      else {
LAB_003eb255:
        bVar12 = true;
        uVar10 = 0;
      }
LAB_003eb2fe:
      if (!bVar12) {
        return false;
      }
      uVar9 = uVar9 + 1;
      bVar11 = uVar9 < (ulong)(((long)(this->Builder->Processes).
                                      super__Vector_base<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->Builder->Processes).
                                      super__Vector_base<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3) *
                              -0x5555555555555555);
      bVar12 = !bVar11;
    } while (bVar11);
  }
  return bVar12;
}

Assistant:

bool cmUVProcessChain::InternalData::Prepare(
  const cmUVProcessChainBuilder* builder)
{
  this->Builder = builder;

  if (this->Builder->Loop) {
    this->Loop = this->Builder->Loop;
  } else {
    this->BuiltinLoop.init();
    this->Loop = this->BuiltinLoop;
  }

  auto const& input =
    this->Builder->Stdio[cmUVProcessChainBuilder::Stream_INPUT];
  auto& inputData = this->InputStreamData;
  switch (input.Type) {
    case cmUVProcessChainBuilder::None:
      inputData.Stdio.flags = UV_IGNORE;
      break;

    case cmUVProcessChainBuilder::Builtin: {
      // FIXME
      break;
    }

    case cmUVProcessChainBuilder::External:
      inputData.Stdio.flags = UV_INHERIT_FD;
      inputData.Stdio.data.fd = input.FileDescriptor;
      break;
  }

  auto const& error =
    this->Builder->Stdio[cmUVProcessChainBuilder::Stream_ERROR];
  auto& errorData = this->ErrorStreamData;
  switch (error.Type) {
    case cmUVProcessChainBuilder::None:
      errorData.Stdio.flags = UV_IGNORE;
      break;

    case cmUVProcessChainBuilder::Builtin: {
      int pipeFd[2];
      if (cmGetPipes(pipeFd) < 0) {
        return false;
      }

      errorData.BuiltinStream = pipeFd[0];
      errorData.Stdio.flags = UV_INHERIT_FD;
      errorData.Stdio.data.fd = pipeFd[1];

      if (this->TempErrorPipe.init(*this->Loop, 0) < 0) {
        return false;
      }
      if (uv_pipe_open(this->TempErrorPipe, errorData.Stdio.data.fd) < 0) {
        return false;
      }

      break;
    }

    case cmUVProcessChainBuilder::External:
      errorData.Stdio.flags = UV_INHERIT_FD;
      errorData.Stdio.data.fd = error.FileDescriptor;
      break;
  }

  auto const& output =
    this->Builder->Stdio[cmUVProcessChainBuilder::Stream_OUTPUT];
  auto& outputData = this->OutputStreamData;
  switch (output.Type) {
    case cmUVProcessChainBuilder::None:
      outputData.Stdio.flags = UV_IGNORE;
      break;

    case cmUVProcessChainBuilder::Builtin:
      if (this->Builder->MergedBuiltinStreams) {
        outputData.BuiltinStream = errorData.BuiltinStream;
        outputData.Stdio.flags = UV_INHERIT_FD;
        outputData.Stdio.data.fd = errorData.Stdio.data.fd;
      } else {
        int pipeFd[2];
        if (cmGetPipes(pipeFd) < 0) {
          return false;
        }

        outputData.BuiltinStream = pipeFd[0];
        outputData.Stdio.flags = UV_INHERIT_FD;
        outputData.Stdio.data.fd = pipeFd[1];

        if (this->TempOutputPipe.init(*this->Loop, 0) < 0) {
          return false;
        }
        if (uv_pipe_open(this->TempOutputPipe, outputData.Stdio.data.fd) < 0) {
          return false;
        }
      }
      break;

    case cmUVProcessChainBuilder::External:
      outputData.Stdio.flags = UV_INHERIT_FD;
      outputData.Stdio.data.fd = output.FileDescriptor;
      break;
  }

  bool first = true;
  for (std::size_t i = 0; i < this->Builder->Processes.size(); i++) {
    this->Processes.emplace_back(cm::make_unique<ProcessData>());
    auto& process = *this->Processes.back();
    process.Data = this;
    process.ProcessStatus.Finished = false;

    if (!first) {
      auto& prevProcess = *this->Processes[i - 1];

      int pipeFd[2];
      if (cmGetPipes(pipeFd) < 0) {
        return false;
      }

      if (prevProcess.OutputPipe.init(*this->Loop, 0) < 0) {
        return false;
      }
      if (uv_pipe_open(prevProcess.OutputPipe, pipeFd[1]) < 0) {
        return false;
      }
      if (process.InputPipe.init(*this->Loop, 0) < 0) {
        return false;
      }
      if (uv_pipe_open(process.InputPipe, pipeFd[0]) < 0) {
        return false;
      }
    }

    first = false;
  }

  return true;
}